

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

void __thiscall sf::VertexBuffer::VertexBuffer(VertexBuffer *this,VertexBuffer *copy)

{
  bool bVar1;
  ostream *poVar2;
  size_t in_RSI;
  VertexBuffer *in_RDI;
  VertexBuffer *in_stack_00000010;
  VertexBuffer *in_stack_00000018;
  VertexBuffer *this_00;
  
  this_00 = in_RDI;
  Drawable::Drawable(&in_RDI->super_Drawable);
  GlResource::GlResource((GlResource *)0x2d5dd7);
  (in_RDI->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__VertexBuffer_00480890;
  in_RDI->m_buffer = 0;
  in_RDI->m_size = 0;
  in_RDI->m_primitiveType = *(PrimitiveType *)(in_RSI + 0x18);
  in_RDI->m_usage = *(Usage *)(in_RSI + 0x1c);
  if ((*(int *)(in_RSI + 8) != 0) && (*(long *)(in_RSI + 0x10) != 0)) {
    bVar1 = create(this_00,in_RSI);
    if (bVar1) {
      bVar1 = update(in_stack_00000018,in_stack_00000010);
      if (!bVar1) {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Could not copy vertex buffer");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Could not create vertex buffer for copying");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

VertexBuffer::VertexBuffer(const VertexBuffer& copy) :
m_buffer       (0),
m_size         (0),
m_primitiveType(copy.m_primitiveType),
m_usage        (copy.m_usage)
{
    if (copy.m_buffer && copy.m_size)
    {
        if (!create(copy.m_size))
        {
            err() << "Could not create vertex buffer for copying" << std::endl;
            return;
        }

        if (!update(copy))
            err() << "Could not copy vertex buffer" << std::endl;
    }
}